

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O0

bool __thiscall GenCADFile::parse_file(GenCADFile *this,vector<char,_std::allocator<char>_> *buf)

{
  int iVar1;
  string *psVar2;
  undefined8 uVar3;
  mpc_ast_t *pmVar4;
  vector<char,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  string *error;
  string parser_error_1;
  BRDPart part_1;
  int i;
  mpc_ast_t *optional_routes_ast;
  mpc_ast_t *optional_board_ast;
  mpc_ast_t *ast;
  mpc_result_t r;
  string parser_error;
  mpc_err_t *language_error;
  mpc_parser_t *gencad_file;
  mpc_parser_t *changes;
  mpc_parser_t *change;
  mpc_parser_t *dev_change;
  mpc_parser_t *sig_change;
  mpc_parser_t *pseudos;
  mpc_parser_t *pseudo_via;
  mpc_parser_t *pseudo_powerpin;
  mpc_parser_t *pseudo_testpin;
  mpc_parser_t *pseudo_pin;
  mpc_parser_t *pseudo_padstack;
  mpc_parser_t *pseudo_testpad;
  mpc_parser_t *pseudo_component;
  mpc_parser_t *pseudo_shape;
  mpc_parser_t *pseudo_part;
  mpc_parser_t *pseudo_device;
  mpc_parser_t *pseudo_signal;
  mpc_parser_t *powerpins;
  mpc_parser_t *powerpin;
  mpc_parser_t *testpins;
  mpc_parser_t *testpin;
  mpc_parser_t *mech;
  mpc_parser_t *mechanical;
  mpc_parser_t *fhole;
  mpc_parser_t *hole;
  mpc_parser_t *routes;
  mpc_parser_t *plane;
  mpc_parser_t *testpad;
  mpc_parser_t *via;
  mpc_parser_t *nailloc_;
  mpc_parser_t *route;
  mpc_parser_t *track_;
  mpc_parser_t *layers;
  mpc_parser_t *layer_;
  mpc_parser_t *layerset;
  mpc_parser_t *define;
  mpc_parser_t *tracks;
  mpc_parser_t *track;
  mpc_parser_t *signals;
  mpc_parser_t *signal;
  mpc_parser_t *nailloc;
  mpc_parser_t *node;
  mpc_parser_t *devices;
  mpc_parser_t *device;
  mpc_parser_t *partnumber;
  mpc_parser_t *value;
  mpc_parser_t *desc;
  mpc_parser_t *volts;
  mpc_parser_t *ntol;
  mpc_parser_t *ptol;
  mpc_parser_t *tol;
  mpc_parser_t *pincount;
  mpc_parser_t *pinfunct;
  mpc_parser_t *pindesc;
  mpc_parser_t *package;
  mpc_parser_t *style;
  mpc_parser_t *type;
  mpc_parser_t *partemp;
  mpc_parser_t *part;
  mpc_parser_t *components;
  mpc_parser_t *component;
  mpc_parser_t *sheet;
  mpc_parser_t *artwork_;
  mpc_parser_t *shape_;
  mpc_parser_t *rotation;
  mpc_parser_t *place;
  mpc_parser_t *device_;
  mpc_parser_t *device_name;
  mpc_parser_t *shapes;
  mpc_parser_t *shape;
  mpc_parser_t *shapes_pin;
  mpc_parser_t *shape_pin_name;
  mpc_parser_t *fid;
  mpc_parser_t *shape_artwork;
  mpc_parser_t *height_;
  mpc_parser_t *insert;
  mpc_parser_t *fiducial;
  mpc_parser_t *artworks;
  mpc_parser_t *artworks_artwork;
  mpc_parser_t *text;
  mpc_parser_t *filled;
  mpc_parser_t *named_layer;
  mpc_parser_t *layer_name;
  mpc_parser_t *padstacks;
  mpc_parser_t *padstack;
  mpc_parser_t *padstacks_pad;
  mpc_parser_t *pads;
  mpc_parser_t *pad;
  mpc_parser_t *board;
  mpc_parser_t *artwork;
  mpc_parser_t *mask;
  mpc_parser_t *cutout;
  mpc_parser_t *rectangle;
  mpc_parser_t *circle;
  mpc_parser_t *arc;
  mpc_parser_t *line;
  mpc_parser_t *thickness;
  mpc_parser_t *name;
  mpc_parser_t *attribute;
  mpc_parser_t *intertrack;
  mpc_parser_t *origin;
  mpc_parser_t *units;
  mpc_parser_t *unit;
  mpc_parser_t *revision;
  mpc_parser_t *drawing;
  mpc_parser_t *user;
  mpc_parser_t *gencad_version;
  mpc_parser_t *version;
  mpc_parser_t *minor;
  mpc_parser_t *major;
  mpc_parser_t *header;
  mpc_parser_t *x_y_ref;
  mpc_parser_t *y;
  mpc_parser_t *x;
  mpc_parser_t *via_name;
  mpc_parser_t *track_width;
  mpc_parser_t *track_name;
  mpc_parser_t *tp_name;
  mpc_parser_t *text_par;
  mpc_parser_t *text_text;
  mpc_parser_t *text_size;
  mpc_parser_t *testpad_name;
  mpc_parser_t *tan;
  mpc_parser_t *sig_name_to_end;
  mpc_parser_t *sig_name;
  mpc_parser_t *shape_name;
  mpc_parser_t *rot;
  mpc_parser_t *rectangle_ref;
  mpc_parser_t *probe;
  mpc_parser_t *pin_name;
  mpc_parser_t *part_name_to_end;
  mpc_parser_t *part_name;
  mpc_parser_t *pad_type;
  mpc_parser_t *pad_name;
  mpc_parser_t *mirror;
  mpc_parser_t *line_ref;
  mpc_parser_t *line_end;
  mpc_parser_t *line_start;
  mpc_parser_t *layer;
  mpc_parser_t *layer_index;
  mpc_parser_t *width;
  mpc_parser_t *height;
  mpc_parser_t *flip;
  mpc_parser_t *filled_ref;
  mpc_parser_t *filename;
  mpc_parser_t *fid_name;
  mpc_parser_t *drill_size;
  mpc_parser_t *dimension;
  mpc_parser_t *component_name;
  mpc_parser_t *circle_ref;
  mpc_parser_t *radius;
  mpc_parser_t *attribute_data;
  mpc_parser_t *attribute_name;
  mpc_parser_t *attribute_category;
  mpc_parser_t *artwork_name;
  mpc_parser_t *arc_ref;
  mpc_parser_t *arc_p2;
  mpc_parser_t *arc_p1;
  mpc_parser_t *arc_center;
  mpc_parser_t *arc_end;
  mpc_parser_t *arc_start;
  mpc_parser_t *wrapper_to_end;
  mpc_parser_t *string_to_end;
  mpc_parser_t *nonquoted_string;
  mpc_parser_t *string;
  mpc_parser_t *p_integer;
  mpc_parser_t *number;
  mpc_parser_t *sign;
  mpc_parser_t *n;
  mpc_parser_t *s;
  bool ret;
  mpc_parser_t *tag;
  char *in_stack_ffffffffffffe950;
  mpc_result_t *r_00;
  value_type *__x;
  BRDPart *this_00;
  GenCADFile *this_01;
  mpc_parser_t *filename_00;
  mpc_err_t *x_00;
  mpc_parser_t *__a;
  mpc_parser_t *__s;
  mpc_parser_t *this_02;
  BRDFileBase *this_03;
  GenCADFile *this_04;
  mpc_ast_t *board_ast;
  GenCADFile *this_05;
  allocator<char> local_679;
  string local_678 [32];
  char *local_658;
  int local_630;
  undefined4 local_628;
  int local_60c;
  mpc_ast_t *local_608;
  undefined1 local_600;
  undefined1 local_5fe;
  undefined1 local_5fc;
  undefined1 local_5fa;
  mpc_ast_t *local_5f8;
  undefined1 local_5ec;
  undefined1 local_5ea;
  long local_5e8;
  long local_5e0;
  allocator<char> local_5c1;
  string local_5c0 [32];
  mpc_err_t *local_5a0;
  mpc_parser_t *local_598;
  mpc_parser_t *local_590;
  mpc_parser_t *local_588;
  mpc_parser_t *local_580;
  mpc_parser_t *local_578;
  mpc_parser_t *local_570;
  mpc_parser_t *local_568;
  mpc_parser_t *local_560;
  mpc_parser_t *local_558;
  mpc_parser_t *local_550;
  mpc_parser_t *local_548;
  mpc_parser_t *local_540;
  mpc_parser_t *local_538;
  mpc_parser_t *local_530;
  mpc_parser_t *local_528;
  mpc_parser_t *local_520;
  mpc_parser_t *local_518;
  mpc_parser_t *local_510;
  mpc_parser_t *local_508;
  mpc_parser_t *local_500;
  mpc_parser_t *local_4f8;
  mpc_parser_t *local_4f0;
  mpc_parser_t *local_4e8;
  mpc_parser_t *local_4e0;
  mpc_parser_t *local_4d8;
  mpc_parser_t *local_4d0;
  mpc_parser_t *local_4c8;
  mpc_parser_t *local_4c0;
  mpc_parser_t *local_4b8;
  mpc_parser_t *local_4b0;
  mpc_parser_t *local_4a8;
  mpc_parser_t *local_4a0;
  mpc_parser_t *local_498;
  mpc_parser_t *local_490;
  mpc_parser_t *local_488;
  mpc_parser_t *local_480;
  mpc_parser_t *local_478;
  mpc_parser_t *local_470;
  mpc_parser_t *local_468;
  mpc_parser_t *local_460;
  mpc_parser_t *local_458;
  mpc_parser_t *local_450;
  mpc_parser_t *local_448;
  mpc_parser_t *local_440;
  mpc_parser_t *local_438;
  mpc_parser_t *local_430;
  mpc_parser_t *local_428;
  mpc_parser_t *local_420;
  mpc_parser_t *local_418;
  mpc_parser_t *local_410;
  mpc_parser_t *local_408;
  mpc_parser_t *local_400;
  mpc_parser_t *local_3f8;
  mpc_parser_t *local_3f0;
  mpc_parser_t *local_3e8;
  mpc_parser_t *local_3e0;
  mpc_parser_t *local_3d8;
  mpc_parser_t *local_3d0;
  mpc_parser_t *local_3c8;
  mpc_parser_t *local_3c0;
  mpc_parser_t *local_3b8;
  mpc_parser_t *local_3b0;
  mpc_parser_t *local_3a8;
  mpc_parser_t *local_3a0;
  mpc_parser_t *local_398;
  mpc_parser_t *local_390;
  mpc_parser_t *local_388;
  mpc_parser_t *local_380;
  mpc_parser_t *local_378;
  mpc_parser_t *local_370;
  mpc_parser_t *local_368;
  mpc_parser_t *local_360;
  mpc_parser_t *local_358;
  mpc_parser_t *local_350;
  mpc_parser_t *local_348;
  mpc_parser_t *local_340;
  mpc_parser_t *local_338;
  mpc_parser_t *local_330;
  mpc_parser_t *local_328;
  mpc_parser_t *local_320;
  mpc_parser_t *local_318;
  mpc_parser_t *local_310;
  mpc_parser_t *local_308;
  mpc_parser_t *local_300;
  mpc_parser_t *local_2f8;
  mpc_parser_t *local_2f0;
  mpc_parser_t *local_2e8;
  mpc_parser_t *local_2e0;
  mpc_parser_t *local_2d8;
  mpc_parser_t *local_2d0;
  mpc_parser_t *local_2c8;
  mpc_parser_t *local_2c0;
  mpc_parser_t *local_2b8;
  mpc_parser_t *local_2b0;
  mpc_parser_t *local_2a8;
  mpc_parser_t *local_2a0;
  mpc_parser_t *local_298;
  mpc_parser_t *local_290;
  mpc_parser_t *local_288;
  mpc_parser_t *local_280;
  mpc_parser_t *local_278;
  mpc_parser_t *local_270;
  mpc_parser_t *local_268;
  mpc_parser_t *local_260;
  mpc_parser_t *local_258;
  mpc_parser_t *local_250;
  mpc_parser_t *local_248;
  mpc_parser_t *local_240;
  mpc_parser_t *local_238;
  mpc_parser_t *local_230;
  mpc_parser_t *local_228;
  mpc_parser_t *local_220;
  mpc_parser_t *local_218;
  mpc_parser_t *local_210;
  GenCADFile *local_208;
  mpc_ast_t *local_200;
  GenCADFile *local_1f8;
  mpc_parser_t *local_1f0;
  mpc_parser_t *local_1e8;
  mpc_parser_t *local_1e0;
  mpc_parser_t *local_1d8;
  mpc_parser_t *local_1d0;
  mpc_parser_t *local_1c8;
  mpc_parser_t *local_1c0;
  mpc_parser_t *local_1b8;
  mpc_parser_t *local_1b0;
  mpc_parser_t *local_1a8;
  mpc_parser_t *local_1a0;
  mpc_parser_t *local_198;
  mpc_parser_t *local_190;
  mpc_parser_t *local_188;
  mpc_parser_t *local_180;
  mpc_parser_t *local_178;
  mpc_parser_t *local_170;
  mpc_parser_t *local_168;
  mpc_parser_t *local_160;
  mpc_parser_t *local_158;
  mpc_parser_t *local_150;
  mpc_parser_t *local_148;
  mpc_parser_t *local_140;
  mpc_parser_t *local_138;
  mpc_parser_t *local_130;
  mpc_parser_t *local_128;
  mpc_parser_t *local_120;
  mpc_parser_t *local_118;
  mpc_parser_t *local_110;
  mpc_parser_t *local_108;
  mpc_parser_t *local_100;
  mpc_parser_t *local_f8;
  mpc_parser_t *local_f0;
  mpc_parser_t *local_e8;
  mpc_parser_t *local_e0;
  mpc_parser_t *local_d8;
  mpc_parser_t *local_d0;
  BRDFileBase *local_c8;
  mpc_parser_t *local_c0;
  mpc_parser_t *local_b8;
  mpc_parser_t *local_b0;
  mpc_parser_t *local_a8;
  mpc_err_t *local_a0;
  mpc_parser_t *local_98;
  GenCADFile *local_90;
  BRDPart *local_88;
  value_type *local_80;
  mpc_result_t *local_78;
  mpc_parser_t *local_70;
  mpc_parser_t *local_68;
  mpc_parser_t *local_60;
  mpc_parser_t *local_58;
  mpc_parser_t *local_50;
  byte local_41;
  vector<char,_std::allocator<char>_> *local_40;
  
  local_41 = 0;
  local_40 = in_RSI;
  local_50 = mpc_new(in_stack_ffffffffffffe950);
  local_58 = mpc_new(in_stack_ffffffffffffe950);
  local_60 = mpc_new(in_stack_ffffffffffffe950);
  local_68 = mpc_new(in_stack_ffffffffffffe950);
  local_70 = mpc_new(in_stack_ffffffffffffe950);
  local_78 = (mpc_result_t *)mpc_new(in_stack_ffffffffffffe950);
  local_80 = (value_type *)mpc_new(in_stack_ffffffffffffe950);
  local_88 = (BRDPart *)mpc_new(in_stack_ffffffffffffe950);
  local_90 = (GenCADFile *)mpc_new(in_stack_ffffffffffffe950);
  local_98 = mpc_new(in_stack_ffffffffffffe950);
  local_a0 = (mpc_err_t *)mpc_new(in_stack_ffffffffffffe950);
  local_a8 = mpc_new(in_stack_ffffffffffffe950);
  local_b0 = mpc_new(in_stack_ffffffffffffe950);
  local_b8 = mpc_new(in_stack_ffffffffffffe950);
  local_c0 = mpc_new(in_stack_ffffffffffffe950);
  local_c8 = (BRDFileBase *)mpc_new(in_stack_ffffffffffffe950);
  local_d0 = mpc_new(in_stack_ffffffffffffe950);
  local_d8 = mpc_new(in_stack_ffffffffffffe950);
  local_e0 = mpc_new(in_stack_ffffffffffffe950);
  local_e8 = mpc_new(in_stack_ffffffffffffe950);
  local_f0 = mpc_new(in_stack_ffffffffffffe950);
  local_f8 = mpc_new(in_stack_ffffffffffffe950);
  local_100 = mpc_new(in_stack_ffffffffffffe950);
  local_108 = mpc_new(in_stack_ffffffffffffe950);
  local_110 = mpc_new(in_stack_ffffffffffffe950);
  local_118 = mpc_new(in_stack_ffffffffffffe950);
  local_120 = mpc_new(in_stack_ffffffffffffe950);
  local_128 = mpc_new(in_stack_ffffffffffffe950);
  local_130 = mpc_new(in_stack_ffffffffffffe950);
  local_138 = mpc_new(in_stack_ffffffffffffe950);
  local_140 = mpc_new(in_stack_ffffffffffffe950);
  local_148 = mpc_new(in_stack_ffffffffffffe950);
  local_150 = mpc_new(in_stack_ffffffffffffe950);
  local_158 = mpc_new(in_stack_ffffffffffffe950);
  local_160 = mpc_new(in_stack_ffffffffffffe950);
  local_168 = mpc_new(in_stack_ffffffffffffe950);
  local_170 = mpc_new(in_stack_ffffffffffffe950);
  local_178 = mpc_new(in_stack_ffffffffffffe950);
  local_180 = mpc_new(in_stack_ffffffffffffe950);
  local_188 = mpc_new(in_stack_ffffffffffffe950);
  local_190 = mpc_new(in_stack_ffffffffffffe950);
  local_198 = mpc_new(in_stack_ffffffffffffe950);
  local_1a0 = mpc_new(in_stack_ffffffffffffe950);
  local_1a8 = mpc_new(in_stack_ffffffffffffe950);
  local_1b0 = mpc_new(in_stack_ffffffffffffe950);
  local_1b8 = mpc_new(in_stack_ffffffffffffe950);
  local_1c0 = mpc_new(in_stack_ffffffffffffe950);
  local_1c8 = mpc_new(in_stack_ffffffffffffe950);
  local_1d0 = mpc_new(in_stack_ffffffffffffe950);
  local_1d8 = mpc_new(in_stack_ffffffffffffe950);
  local_1e0 = mpc_new(in_stack_ffffffffffffe950);
  local_1e8 = mpc_new(in_stack_ffffffffffffe950);
  local_1f0 = mpc_new(in_stack_ffffffffffffe950);
  local_1f8 = (GenCADFile *)mpc_new(in_stack_ffffffffffffe950);
  local_200 = (mpc_ast_t *)mpc_new(in_stack_ffffffffffffe950);
  local_208 = (GenCADFile *)mpc_new(in_stack_ffffffffffffe950);
  local_210 = mpc_new(in_stack_ffffffffffffe950);
  local_218 = mpc_new(in_stack_ffffffffffffe950);
  local_220 = mpc_new(in_stack_ffffffffffffe950);
  local_228 = mpc_new(in_stack_ffffffffffffe950);
  local_230 = mpc_new(in_stack_ffffffffffffe950);
  local_238 = mpc_new(in_stack_ffffffffffffe950);
  local_240 = mpc_new(in_stack_ffffffffffffe950);
  local_248 = mpc_new(in_stack_ffffffffffffe950);
  local_250 = mpc_new(in_stack_ffffffffffffe950);
  local_258 = mpc_new(in_stack_ffffffffffffe950);
  local_260 = mpc_new(in_stack_ffffffffffffe950);
  local_268 = mpc_new(in_stack_ffffffffffffe950);
  local_270 = mpc_new(in_stack_ffffffffffffe950);
  local_278 = mpc_new(in_stack_ffffffffffffe950);
  local_280 = mpc_new(in_stack_ffffffffffffe950);
  local_288 = mpc_new(in_stack_ffffffffffffe950);
  local_290 = mpc_new(in_stack_ffffffffffffe950);
  local_298 = mpc_new(in_stack_ffffffffffffe950);
  local_2a0 = mpc_new(in_stack_ffffffffffffe950);
  local_2a8 = mpc_new(in_stack_ffffffffffffe950);
  local_2b0 = mpc_new(in_stack_ffffffffffffe950);
  local_2b8 = mpc_new(in_stack_ffffffffffffe950);
  local_2c0 = mpc_new(in_stack_ffffffffffffe950);
  local_2c8 = mpc_new(in_stack_ffffffffffffe950);
  local_2d0 = mpc_new(in_stack_ffffffffffffe950);
  local_2d8 = mpc_new(in_stack_ffffffffffffe950);
  local_2e0 = mpc_new(in_stack_ffffffffffffe950);
  local_2e8 = mpc_new(in_stack_ffffffffffffe950);
  local_2f0 = mpc_new(in_stack_ffffffffffffe950);
  local_2f8 = mpc_new(in_stack_ffffffffffffe950);
  local_300 = mpc_new(in_stack_ffffffffffffe950);
  local_308 = mpc_new(in_stack_ffffffffffffe950);
  local_310 = mpc_new(in_stack_ffffffffffffe950);
  local_318 = mpc_new(in_stack_ffffffffffffe950);
  local_320 = mpc_new(in_stack_ffffffffffffe950);
  local_328 = mpc_new(in_stack_ffffffffffffe950);
  local_330 = mpc_new(in_stack_ffffffffffffe950);
  local_338 = mpc_new(in_stack_ffffffffffffe950);
  local_340 = mpc_new(in_stack_ffffffffffffe950);
  local_348 = mpc_new(in_stack_ffffffffffffe950);
  local_350 = mpc_new(in_stack_ffffffffffffe950);
  local_358 = mpc_new(in_stack_ffffffffffffe950);
  local_360 = mpc_new(in_stack_ffffffffffffe950);
  local_368 = mpc_new(in_stack_ffffffffffffe950);
  local_370 = mpc_new(in_stack_ffffffffffffe950);
  local_378 = mpc_new(in_stack_ffffffffffffe950);
  local_380 = mpc_new(in_stack_ffffffffffffe950);
  local_388 = mpc_new(in_stack_ffffffffffffe950);
  local_390 = mpc_new(in_stack_ffffffffffffe950);
  local_398 = mpc_new(in_stack_ffffffffffffe950);
  local_3a0 = mpc_new(in_stack_ffffffffffffe950);
  local_3a8 = mpc_new(in_stack_ffffffffffffe950);
  local_3b0 = mpc_new(in_stack_ffffffffffffe950);
  local_3b8 = mpc_new(in_stack_ffffffffffffe950);
  local_3c0 = mpc_new(in_stack_ffffffffffffe950);
  local_3c8 = mpc_new(in_stack_ffffffffffffe950);
  local_3d0 = mpc_new(in_stack_ffffffffffffe950);
  local_3d8 = mpc_new(in_stack_ffffffffffffe950);
  local_3e0 = mpc_new(in_stack_ffffffffffffe950);
  local_3e8 = mpc_new(in_stack_ffffffffffffe950);
  local_3f0 = mpc_new(in_stack_ffffffffffffe950);
  local_3f8 = mpc_new(in_stack_ffffffffffffe950);
  local_400 = mpc_new(in_stack_ffffffffffffe950);
  local_408 = mpc_new(in_stack_ffffffffffffe950);
  local_410 = mpc_new(in_stack_ffffffffffffe950);
  local_418 = mpc_new(in_stack_ffffffffffffe950);
  local_420 = mpc_new(in_stack_ffffffffffffe950);
  local_428 = mpc_new(in_stack_ffffffffffffe950);
  local_430 = mpc_new(in_stack_ffffffffffffe950);
  local_438 = mpc_new(in_stack_ffffffffffffe950);
  local_440 = mpc_new(in_stack_ffffffffffffe950);
  local_448 = mpc_new(in_stack_ffffffffffffe950);
  local_450 = mpc_new(in_stack_ffffffffffffe950);
  local_458 = mpc_new(in_stack_ffffffffffffe950);
  local_460 = mpc_new(in_stack_ffffffffffffe950);
  local_468 = mpc_new(in_stack_ffffffffffffe950);
  local_470 = mpc_new(in_stack_ffffffffffffe950);
  local_478 = mpc_new(in_stack_ffffffffffffe950);
  local_480 = mpc_new(in_stack_ffffffffffffe950);
  local_488 = mpc_new(in_stack_ffffffffffffe950);
  local_490 = mpc_new(in_stack_ffffffffffffe950);
  local_498 = mpc_new(in_stack_ffffffffffffe950);
  local_4a0 = mpc_new(in_stack_ffffffffffffe950);
  local_4a8 = mpc_new(in_stack_ffffffffffffe950);
  local_4b0 = mpc_new(in_stack_ffffffffffffe950);
  local_4b8 = mpc_new(in_stack_ffffffffffffe950);
  local_4c0 = mpc_new(in_stack_ffffffffffffe950);
  local_4c8 = mpc_new(in_stack_ffffffffffffe950);
  local_4d0 = mpc_new(in_stack_ffffffffffffe950);
  local_4d8 = mpc_new(in_stack_ffffffffffffe950);
  local_4e0 = mpc_new(in_stack_ffffffffffffe950);
  local_4e8 = mpc_new(in_stack_ffffffffffffe950);
  local_4f0 = mpc_new(in_stack_ffffffffffffe950);
  local_4f8 = mpc_new(in_stack_ffffffffffffe950);
  local_500 = mpc_new(in_stack_ffffffffffffe950);
  local_508 = mpc_new(in_stack_ffffffffffffe950);
  local_510 = mpc_new(in_stack_ffffffffffffe950);
  local_518 = mpc_new(in_stack_ffffffffffffe950);
  local_520 = mpc_new(in_stack_ffffffffffffe950);
  local_528 = mpc_new(in_stack_ffffffffffffe950);
  local_530 = mpc_new(in_stack_ffffffffffffe950);
  local_538 = mpc_new(in_stack_ffffffffffffe950);
  local_540 = mpc_new(in_stack_ffffffffffffe950);
  local_548 = mpc_new(in_stack_ffffffffffffe950);
  local_550 = mpc_new(in_stack_ffffffffffffe950);
  local_558 = mpc_new(in_stack_ffffffffffffe950);
  local_560 = mpc_new(in_stack_ffffffffffffe950);
  local_568 = mpc_new(in_stack_ffffffffffffe950);
  local_570 = mpc_new(in_stack_ffffffffffffe950);
  local_578 = mpc_new(in_stack_ffffffffffffe950);
  local_580 = mpc_new(in_stack_ffffffffffffe950);
  local_588 = mpc_new(in_stack_ffffffffffffe950);
  local_590 = mpc_new(in_stack_ffffffffffffe950);
  local_598 = mpc_new(in_stack_ffffffffffffe950);
  tag = local_70;
  r_00 = local_78;
  __x = local_80;
  this_00 = local_88;
  this_01 = local_90;
  filename_00 = local_98;
  x_00 = local_a0;
  __a = local_a8;
  __s = local_b0;
  this_02 = local_b8;
  this_03 = local_c8;
  this_04 = local_1f8;
  board_ast = local_200;
  this_05 = local_208;
  local_5a0 = mpca_lang(2,kGenCadFileBnf,local_50,local_58,local_60,local_68);
  if (local_5a0 != (mpc_err_t *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
               (char *)__s,(allocator<char> *)__a);
    std::allocator<char>::~allocator(&local_5c1);
    mpc_err_string(x_00);
    std::__cxx11::string::append((char *)local_5c0);
    mpc_err_delete((mpc_err_t *)r_00);
    psVar2 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(psVar2,local_5c0);
    __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  local_5e8 = 0;
  local_41 = 1;
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x1890a4);
  std::vector<char,_std::allocator<char>_>::size(local_40);
  iVar1 = mpc_nparse((char *)filename_00,(char *)this_01,(size_t)this_00,(mpc_parser_t *)__x,r_00);
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
               (char *)__s,(allocator<char> *)__a);
    std::allocator<char>::~allocator(&local_679);
    mpc_err_string(x_00);
    std::__cxx11::string::append((char *)local_678);
    mpc_err_delete((mpc_err_t *)r_00);
    psVar2 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(psVar2,local_678);
    __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  local_5e8 = local_5e0;
  if (local_5e0 == 0) {
    local_5ea = 1;
    uVar3 = __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
               (char *)__s,(allocator<char> *)__a);
    local_5ea = 0;
    __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  pmVar4 = mpc_ast_get_child((mpc_ast_t *)r_00,(char *)tag);
  *(mpc_ast_t **)(in_RDI + 200) = pmVar4;
  if (*(long *)(in_RDI + 200) == 0) {
    local_5ec = 1;
    uVar3 = __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
               (char *)__s,(allocator<char> *)__a);
    local_5ec = 0;
    __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  local_5f8 = mpc_ast_get_child((mpc_ast_t *)r_00,(char *)tag);
  pmVar4 = mpc_ast_get_child((mpc_ast_t *)r_00,(char *)tag);
  *(mpc_ast_t **)(in_RDI + 0xf0) = pmVar4;
  if (*(long *)(in_RDI + 0xf0) == 0) {
    SDL_LogWarn(0,"Failed to parse GenCAD file: the $PADS section was not parsed properly");
  }
  pmVar4 = mpc_ast_get_child((mpc_ast_t *)r_00,(char *)tag);
  *(mpc_ast_t **)(in_RDI + 0xf8) = pmVar4;
  if (*(long *)(in_RDI + 0xf8) == 0) {
    SDL_LogWarn(0,"Failed to parse GenCAD file: the $PADSTACKS section was not parsed properly");
  }
  pmVar4 = mpc_ast_get_child((mpc_ast_t *)r_00,(char *)tag);
  *(mpc_ast_t **)(in_RDI + 0xe0) = pmVar4;
  if (*(long *)(in_RDI + 0xe0) == 0) {
    local_5fa = 1;
    uVar3 = __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
               (char *)__s,(allocator<char> *)__a);
    local_5fa = 0;
    __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  pmVar4 = mpc_ast_get_child((mpc_ast_t *)r_00,(char *)tag);
  *(mpc_ast_t **)(in_RDI + 0xe8) = pmVar4;
  if (*(long *)(in_RDI + 0xe8) == 0) {
    local_5fc = 1;
    uVar3 = __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
               (char *)__s,(allocator<char> *)__a);
    local_5fc = 0;
    __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  pmVar4 = mpc_ast_get_child((mpc_ast_t *)r_00,(char *)tag);
  *(mpc_ast_t **)(in_RDI + 0xd8) = pmVar4;
  if (*(long *)(in_RDI + 0xd8) == 0) {
    local_5fe = 1;
    uVar3 = __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
               (char *)__s,(allocator<char> *)__a);
    local_5fe = 0;
    __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  pmVar4 = mpc_ast_get_child((mpc_ast_t *)r_00,(char *)tag);
  *(mpc_ast_t **)(in_RDI + 0xd0) = pmVar4;
  if (*(long *)(in_RDI + 0xd0) == 0) {
    local_600 = 1;
    uVar3 = __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
               (char *)__s,(allocator<char> *)__a);
    local_600 = 0;
    __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  local_608 = mpc_ast_get_child((mpc_ast_t *)r_00,(char *)tag);
  parse_dimension_units(this_01,(mpc_ast_t *)this_00);
  if (local_5f8 != (mpc_ast_t *)0x0) {
    parse_board_outline(this_05,board_ast);
  }
  parse_components(this_04);
  if (local_608 != (mpc_ast_t *)0x0) {
    parse_vias(this_01,(mpc_ast_t *)this_00);
  }
  for (local_60c = 1; local_60c < 3; local_60c = local_60c + 1) {
    BRDPart::BRDPart(this_00);
    local_658 = "...";
    local_630 = (local_60c != 1) + 1;
    local_628 = 0;
    std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
              ((vector<BRDPart,_std::allocator<BRDPart>_> *)this_00,__x);
    BRDPart::~BRDPart((BRDPart *)0x1898dc);
  }
  BRDFileBase::AddNailsAsPins(this_03);
  mpc_cleanup(0xaa,local_50,local_58,local_60,local_68,local_70,local_78,local_80,local_88,local_90,
              local_98,local_a0,local_a8,local_b0,local_b8,local_c0,local_c8,local_d0,local_d8,
              local_e0,local_e8,local_f0,local_f8,local_100,local_108,local_110,local_118,local_120,
              local_128,local_130,local_138,local_140,local_148,local_150,local_158);
  return (bool)(local_41 & 1);
}

Assistant:

bool GenCADFile::parse_file(const std::vector<char> &buf) {
	bool ret = false;
#define X(CVAR, NAME) mpc_parser_t *CVAR = mpc_new((NAME));
	X_MACRO_PARSE_VARS
#undef X

#define X(CVAR, NAME) CVAR,
	mpc_err_t *language_error = mpca_lang(MPCA_LANG_WHITESPACE_SENSITIVE, kGenCadFileBnf, X_MACRO_PARSE_VARS NULL);
#undef X
	try {
		if (language_error != nullptr) {
			std::string parser_error("Failed to parse GenCAD file, parser reported:\n");
			parser_error.append(mpc_err_string(language_error));
			mpc_err_delete(language_error);
			throw parser_error;
		}

		mpc_result_t r;
		mpc_ast_t *ast = nullptr;
		ret            = true;
		if (mpc_nparse("", buf.data(), buf.size(), gencad_file, &r)) {
			ast = static_cast<mpc_ast_t *>(r.output);
			if (!ast) throw std::string("Failed to parse GenCAD file: the file does not match the GenCAD format specification");

			header_ast = mpc_ast_get_child(ast, "header|>");
			if (!header_ast) throw std::string("Failed to parse GenCAD file: the $HEADER section was not parsed properly");

			//sections marked as optinal are not found in some files, for example generated by "XY html to CAD V1.2" utility
			mpc_ast_t *optional_board_ast = mpc_ast_get_child(ast, "board|>");

			pads_ast = mpc_ast_get_child(ast, "pads|>");
			if (!pads_ast) {
				SDL_LogWarn(SDL_LOG_CATEGORY_APPLICATION, "Failed to parse GenCAD file: the $PADS section was not parsed properly");
			}

			padstacks_ast = mpc_ast_get_child(ast, "padstacks|>");
			if (!padstacks_ast) {
				SDL_LogWarn(SDL_LOG_CATEGORY_APPLICATION, "Failed to parse GenCAD file: the $PADSTACKS section was not parsed properly");
			}

			shapes_ast = mpc_ast_get_child(ast, "shapes|>");
			if (!shapes_ast) throw std::string("Failed to parse GenCAD file: the $SHAPES section was not parsed properly");

			components_ast = mpc_ast_get_child(ast, "components|>");
			if (!components_ast) throw std::string("Failed to parse GenCAD file: the $COMPONENTS section was not parsed properly");

			devices_ast = mpc_ast_get_child(ast, "devices|>");
			if (!devices_ast) throw std::string("Failed to parse GenCAD file: the $DEVICES section was not parsed properly");

			signals_ast = mpc_ast_get_child(ast, "signals|>");
			if (!signals_ast) throw std::string("Failed to parse GenCAD file: the $SIGNALS section was not parsed properly");

			//mpc_ast_t *optional_tracks_ast = mpc_ast_get_child(ast, "tracks|>");

			// $LAYERS section is optional and doesn't have to exist in a GenCAD file
			//mpc_ast_t * optional_layers_ast = mpc_ast_get_child(ast, "layers|>");

			mpc_ast_t *optional_routes_ast = mpc_ast_get_child(ast, "routes|>");

			parse_dimension_units(header_ast);
			if (optional_board_ast) {
				parse_board_outline(optional_board_ast);
			}
			parse_components();
			if (optional_routes_ast)
			{
				parse_vias(optional_routes_ast);
			}

			for (auto i = 1; i <= 2; i++) { // Add dummy parts for probe points on both sides
				BRDPart part;
				part.name = "...";
				part.mounting_side =
				    (i == 1 ? BRDPartMountingSide::Bottom : BRDPartMountingSide::Top); // First part is bottom, last is top.
				part.end_of_pins = 0;                                                  // Unused
				parts.push_back(part);
			}

			AddNailsAsPins();

		} else {
			std::string parser_error("Failed to parse GenCAD file, parser reported:\n");
			parser_error.append(mpc_err_string(r.error));
			mpc_err_delete(r.error);
			throw parser_error;
		}
	} catch (std::string &error) {
		ret       = false;
		error_msg = error;
		error_msg.append(
		    "\nIf you think your GenCAD file is correct please report an issue here:\n"
		    "https://github.com/OpenBoardView/OpenBoardView/issues\n");
	}

#define X(CVAR, NAME) CVAR,
	mpc_cleanup(PARSE_VARS_COUNT, X_MACRO_PARSE_VARS NULL);
#undef X
	return ret;
}